

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttrib64BitTest.cpp
# Opt level: O1

void __thiscall VertexAttrib64Bit::GetVertexAttribTest::deinit(GetVertexAttribTest *this)

{
  if (this->m_buffer_object_id != 0) {
    (*(this->super_Base).gl.bindBuffer)(0x8892,0);
    (*(this->super_Base).gl.deleteBuffers)(1,&this->m_buffer_object_id);
    this->m_buffer_object_id = 0;
  }
  if (this->m_vertex_array_object_id != 0) {
    (*(this->super_Base).gl.bindVertexArray)(0);
    (*(this->super_Base).gl.deleteVertexArrays)(1,&this->m_vertex_array_object_id);
    this->m_vertex_array_object_id = 0;
  }
  return;
}

Assistant:

void GetVertexAttribTest::deinit()
{
	if (0 != m_buffer_object_id)
	{
		gl.bindBuffer(GL_ARRAY_BUFFER, 0);
		gl.deleteBuffers(1, &m_buffer_object_id);
		m_buffer_object_id = 0;
	}

	if (0 != m_vertex_array_object_id)
	{
		gl.bindVertexArray(0);
		gl.deleteVertexArrays(1, &m_vertex_array_object_id);
		m_vertex_array_object_id = 0;
	}
}